

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuFail_Line(CuTest *tc,char *file,int line,char *message2,char *message)

{
  undefined1 local_40 [8];
  CuString string;
  char *message_local;
  char *message2_local;
  int line_local;
  char *file_local;
  CuTest *tc_local;
  
  string.buffer = message;
  CuStringInit((CuString *)local_40);
  if (message2 != (char *)0x0) {
    CuStringAppend((CuString *)local_40,message2);
    CuStringAppend((CuString *)local_40,": ");
  }
  CuStringAppend((CuString *)local_40,string.buffer);
  CuFailInternal(tc,file,line,(CuString *)local_40);
  return;
}

Assistant:

void CuFail_Line(CuTest* tc, const char* file, int line, const char* message2, const char* message)
{
	CuString string;

	CuStringInit(&string);
	if (message2 != NULL)
	{
		CuStringAppend(&string, message2);
		CuStringAppend(&string, ": ");
	}
	CuStringAppend(&string, message);
	CuFailInternal(tc, file, line, &string);
}